

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.h
# Opt level: O2

Matrix3d *
CIF::Utilities::generateRotationMatrix<double>
          (Matrix3d *__return_storage_ptr__,Vector3d *ax,double theta)

{
  double *s;
  LhsNested pMVar1;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar2;
  Scalar local_140;
  Scalar local_138;
  MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *local_130;
  MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *local_128;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_120;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_100;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_d8;
  double local_b8;
  LhsNested local_a0;
  RhsNested pMStack_98;
  double local_88;
  Matrix3d c;
  
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalize
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)ax);
  local_d8.m_row = 0;
  local_d8.m_col = 1;
  local_d8.m_currentBlockRows = 1;
  c.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  local_100.m_lhs.m_lhs =
       (LhsNested)
       ((ulong)(ax->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
               array[2] ^ 0x8000000000000000);
  local_d8.m_xpr = (Matrix<double,_3,_3,_0,_3,_3> *)&c;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (&local_d8,(Scalar *)&local_100);
  s = (ax->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array + 1;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar2,s);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,(ax->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                             m_storage.m_data.array + 2);
  local_120.m_lhs = (LhsNested)0x0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_120);
  local_130 = (MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)
              ((ulong)(ax->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                      m_data.array[0] ^ 0x8000000000000000);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_130);
  local_138 = -*s;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_138);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,(Scalar *)ax);
  local_140 = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar2,&local_140);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::finished(&local_d8);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  local_138 = sin(theta);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            (&local_120,(MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)&c,&local_138);
  pMVar1 = local_120.m_lhs;
  local_130 = (MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)&c;
  local_128 = (MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)&c;
  local_140 = cos(theta);
  local_140 = 1.0 - local_140;
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>::
  operator*(&local_100,
            (MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>
             *)&local_130,&local_140);
  local_d8.m_col = (Index)pMVar1;
  local_b8 = local_120.m_rhs.m_functor.m_other;
  local_a0 = local_100.m_lhs.m_lhs;
  pMStack_98 = local_100.m_lhs.m_rhs;
  local_88 = local_100.m_rhs.m_functor.m_other;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>_>
              *)&local_d8);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix3d generateRotationMatrix(Eigen::Vector3d ax, double theta) {
        // https://computergraphics.stackexchange.com/a/2404
        // normalize otherwise our rotation will modify the magnitude?
        ax.normalize();

        Eigen::Matrix3d c;
        c << 0.0, -ax(2), ax(1),
                ax(2), 0.0, -ax(0),
                -ax(1), ax(0), 0.0;

        return Eigen::Matrix3d::Identity() + c * std::sin(theta) + c * c * (1 - std::cos(theta));
    }